

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.hpp
# Opt level: O0

double __thiscall Instance::objval(Instance *this,QpVector *x)

{
  Matrix *in_RDI;
  double dVar1;
  double dVar2;
  QpVector *this_00;
  QpVector *in_stack_ffffffffffffff78;
  QpVector *in_stack_ffffffffffffff80;
  
  dVar1 = QpVector::operator*(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Matrix::vec_mat(in_RDI,in_stack_ffffffffffffff80);
  dVar2 = QpVector::operator*(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (QpVector *)
            (dVar2 * 0.5 + dVar1 +
            (double)(in_RDI->tran).start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  QpVector::~QpVector(this_00);
  return (double)this_00;
}

Assistant:

double objval(const QpVector& x) {
    return c * x + 0.5 * (Q.vec_mat(x) * x) + offset;
  }